

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O2

size_t ZSTDMT_initCStream(ZSTDMT_CCtx *mtctx,int compressionLevel)

{
  size_t sVar1;
  long lVar2;
  ZSTD_CCtx_params *pZVar3;
  undefined8 *puVar4;
  byte bVar5;
  ZSTD_CCtx_params in_stack_fffffffffffffe98;
  ZSTD_parameters params;
  ZSTD_CCtx_params cctxParams;
  
  bVar5 = 0;
  ZSTD_getParams_internal(&params,compressionLevel,0xffffffffffffffff,0);
  memcpy(&cctxParams,&mtctx->params,0x90);
  cctxParams.cParams.windowLog = params.cParams.windowLog;
  cctxParams.cParams.chainLog = params.cParams.chainLog;
  cctxParams.cParams.targetLength = params.cParams.targetLength;
  cctxParams.cParams.strategy = params.cParams.strategy;
  cctxParams.fParams.contentSizeFlag = params.fParams.contentSizeFlag;
  cctxParams.fParams.checksumFlag = params.fParams.checksumFlag;
  cctxParams.fParams.noDictIDFlag = params.fParams.noDictIDFlag;
  pZVar3 = &cctxParams;
  puVar4 = (undefined8 *)&stack0xfffffffffffffe98;
  for (lVar2 = 0x12; lVar2 != 0; lVar2 = lVar2 + -1) {
    *puVar4 = *(undefined8 *)pZVar3;
    pZVar3 = (ZSTD_CCtx_params *)((long)pZVar3 + (ulong)bVar5 * -0x10 + 8);
    puVar4 = puVar4 + (ulong)bVar5 * -2 + 1;
  }
  sVar1 = ZSTDMT_initCStream_internal
                    (mtctx,(void *)0x0,0,ZSTD_dct_auto,(ZSTD_CDict *)0x0,in_stack_fffffffffffffe98,
                     0xffffffffffffffff);
  return sVar1;
}

Assistant:

size_t ZSTDMT_initCStream(ZSTDMT_CCtx* mtctx, int compressionLevel) {
    ZSTD_parameters const params = ZSTD_getParams(compressionLevel, ZSTD_CONTENTSIZE_UNKNOWN, 0);
    ZSTD_CCtx_params cctxParams = mtctx->params;   /* retrieve sticky params */
    DEBUGLOG(4, "ZSTDMT_initCStream (cLevel=%i)", compressionLevel);
    cctxParams.cParams = params.cParams;
    cctxParams.fParams = params.fParams;
    return ZSTDMT_initCStream_internal(mtctx, NULL, 0, ZSTD_dct_auto, NULL, cctxParams, ZSTD_CONTENTSIZE_UNKNOWN);
}